

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_set_server_name(ptls_t *tls,char *server_name,size_t server_name_len)

{
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  char *duped;
  void *local_28;
  size_t local_20;
  
  local_28 = (void *)0x0;
  if (in_RSI != (char *)0x0) {
    local_20 = in_RDX;
    if (in_RDX == 0) {
      local_20 = strlen(in_RSI);
    }
    local_28 = malloc(local_20 + 1);
    if (local_28 == (void *)0x0) {
      return 0x201;
    }
    memcpy(local_28,in_RSI,local_20);
    *(undefined1 *)((long)local_28 + local_20) = 0;
  }
  free(*(void **)(in_RDI + 0x108));
  *(void **)(in_RDI + 0x108) = local_28;
  return 0;
}

Assistant:

int ptls_set_server_name(ptls_t *tls, const char *server_name, size_t server_name_len)
{
    char *duped = NULL;

    if (server_name != NULL) {
        if (server_name_len == 0)
            server_name_len = strlen(server_name);
        if ((duped = malloc(server_name_len + 1)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(duped, server_name, server_name_len);
        duped[server_name_len] = '\0';
    }

    free(tls->server_name);
    tls->server_name = duped;

    return 0;
}